

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O0

void set_hdr_segmentation(Vp8ePutBitBuf *bitbuf,Vp8ePps *ppss,Vp8eHalEntropy *entropy)

{
  int iVar1;
  Pps *pPVar2;
  Pps *pPVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [11];
  undefined1 auVar9 [11];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  bool bVar16;
  bool bVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  byte bVar33;
  RK_S32 local_84;
  RK_S32 local_80;
  int local_7c;
  RK_S32 local_78;
  RK_S32 local_74;
  int local_70;
  int local_6c;
  int local_68;
  RK_S32 local_64;
  RK_S32 local_54;
  RK_S32 sum2;
  RK_S32 sum1;
  Sgm *sgm;
  Pps *pps;
  int iStack_24;
  RK_U8 data_modified;
  RK_S32 tmp;
  RK_S32 i;
  Vp8eHalEntropy *entropy_local;
  Vp8ePps *ppss_local;
  Vp8ePutBitBuf *bitbuf_local;
  
  pPVar2 = ppss->pps;
  pPVar3 = ppss->pps;
  cVar18 = -((char)ppss->qp_sgm[0] == (char)pPVar2->qp_sgm[0]);
  cVar19 = -(*(char *)((long)ppss->qp_sgm + 1) == *(char *)((long)pPVar2->qp_sgm + 1));
  cVar20 = -(*(char *)((long)ppss->qp_sgm + 2) == *(char *)((long)pPVar2->qp_sgm + 2));
  cVar21 = -(*(char *)((long)ppss->qp_sgm + 3) == *(char *)((long)pPVar2->qp_sgm + 3));
  cVar22 = -((char)ppss->qp_sgm[1] == (char)pPVar2->qp_sgm[1]);
  cVar23 = -(*(char *)((long)ppss->qp_sgm + 5) == *(char *)((long)pPVar2->qp_sgm + 5));
  cVar24 = -(*(char *)((long)ppss->qp_sgm + 6) == *(char *)((long)pPVar2->qp_sgm + 6));
  cVar25 = -(*(char *)((long)ppss->qp_sgm + 7) == *(char *)((long)pPVar2->qp_sgm + 7));
  cVar26 = -((char)ppss->qp_sgm[2] == (char)pPVar2->qp_sgm[2]);
  cVar27 = -(*(char *)((long)ppss->qp_sgm + 9) == *(char *)((long)pPVar2->qp_sgm + 9));
  cVar28 = -(*(char *)((long)ppss->qp_sgm + 10) == *(char *)((long)pPVar2->qp_sgm + 10));
  cVar29 = -(*(char *)((long)ppss->qp_sgm + 0xb) == *(char *)((long)pPVar2->qp_sgm + 0xb));
  cVar30 = -((char)ppss->qp_sgm[3] == (char)pPVar2->qp_sgm[3]);
  cVar31 = -(*(char *)((long)ppss->qp_sgm + 0xd) == *(char *)((long)pPVar2->qp_sgm + 0xd));
  cVar32 = -(*(char *)((long)ppss->qp_sgm + 0xe) == *(char *)((long)pPVar2->qp_sgm + 0xe));
  bVar33 = -(*(char *)((long)ppss->qp_sgm + 0xf) == *(char *)((long)pPVar2->qp_sgm + 0xf));
  auVar4[1] = cVar19;
  auVar4[0] = cVar18;
  auVar4[2] = cVar20;
  auVar4[3] = cVar21;
  auVar4[4] = cVar22;
  auVar4[5] = cVar23;
  auVar4[6] = cVar24;
  auVar4[7] = cVar25;
  auVar4[8] = cVar26;
  auVar4[9] = cVar27;
  auVar4[10] = cVar28;
  auVar4[0xb] = cVar29;
  auVar4[0xc] = cVar30;
  auVar4[0xd] = cVar31;
  auVar4[0xe] = cVar32;
  auVar4[0xf] = bVar33;
  auVar5[1] = cVar19;
  auVar5[0] = cVar18;
  auVar5[2] = cVar20;
  auVar5[3] = cVar21;
  auVar5[4] = cVar22;
  auVar5[5] = cVar23;
  auVar5[6] = cVar24;
  auVar5[7] = cVar25;
  auVar5[8] = cVar26;
  auVar5[9] = cVar27;
  auVar5[10] = cVar28;
  auVar5[0xb] = cVar29;
  auVar5[0xc] = cVar30;
  auVar5[0xd] = cVar31;
  auVar5[0xe] = cVar32;
  auVar5[0xf] = bVar33;
  auVar14[1] = cVar21;
  auVar14[0] = cVar20;
  auVar14[2] = cVar22;
  auVar14[3] = cVar23;
  auVar14[4] = cVar24;
  auVar14[5] = cVar25;
  auVar14[6] = cVar26;
  auVar14[7] = cVar27;
  auVar14[8] = cVar28;
  auVar14[9] = cVar29;
  auVar14[10] = cVar30;
  auVar14[0xb] = cVar31;
  auVar14[0xc] = cVar32;
  auVar14[0xd] = bVar33;
  auVar12[1] = cVar22;
  auVar12[0] = cVar21;
  auVar12[2] = cVar23;
  auVar12[3] = cVar24;
  auVar12[4] = cVar25;
  auVar12[5] = cVar26;
  auVar12[6] = cVar27;
  auVar12[7] = cVar28;
  auVar12[8] = cVar29;
  auVar12[9] = cVar30;
  auVar12[10] = cVar31;
  auVar12[0xb] = cVar32;
  auVar12[0xc] = bVar33;
  auVar10[1] = cVar23;
  auVar10[0] = cVar22;
  auVar10[2] = cVar24;
  auVar10[3] = cVar25;
  auVar10[4] = cVar26;
  auVar10[5] = cVar27;
  auVar10[6] = cVar28;
  auVar10[7] = cVar29;
  auVar10[8] = cVar30;
  auVar10[9] = cVar31;
  auVar10[10] = cVar32;
  auVar10[0xb] = bVar33;
  auVar8[1] = cVar24;
  auVar8[0] = cVar23;
  auVar8[2] = cVar25;
  auVar8[3] = cVar26;
  auVar8[4] = cVar27;
  auVar8[5] = cVar28;
  auVar8[6] = cVar29;
  auVar8[7] = cVar30;
  auVar8[8] = cVar31;
  auVar8[9] = cVar32;
  auVar8[10] = bVar33;
  bVar16 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                    (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
                    (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                    (ushort)(SUB111(auVar8 >> 7,0) & 1) << 5 |
                    (ushort)((byte)(CONCAT19(bVar33,CONCAT18(cVar32,CONCAT17(cVar31,CONCAT16(cVar30,
                                                  CONCAT15(cVar29,CONCAT14(cVar28,CONCAT13(cVar27,
                                                  CONCAT12(cVar26,CONCAT11(cVar25,cVar24))))))))) >>
                                   7) & 1) << 6 |
                    (ushort)((byte)(CONCAT18(bVar33,CONCAT17(cVar32,CONCAT16(cVar31,CONCAT15(cVar30,
                                                  CONCAT14(cVar29,CONCAT13(cVar28,CONCAT12(cVar27,
                                                  CONCAT11(cVar26,cVar25)))))))) >> 7) & 1) << 7 |
                   (ushort)(bVar33 >> 7) << 0xf) != 0xffff;
  cVar18 = -((char)ppss->level_sgm[0] == (char)pPVar2->level_sgm[0]);
  cVar19 = -(*(char *)((long)ppss->level_sgm + 1) == *(char *)((long)pPVar2->level_sgm + 1));
  cVar20 = -(*(char *)((long)ppss->level_sgm + 2) == *(char *)((long)pPVar2->level_sgm + 2));
  cVar21 = -(*(char *)((long)ppss->level_sgm + 3) == *(char *)((long)pPVar2->level_sgm + 3));
  cVar22 = -((char)ppss->level_sgm[1] == (char)pPVar2->level_sgm[1]);
  cVar23 = -(*(char *)((long)ppss->level_sgm + 5) == *(char *)((long)pPVar2->level_sgm + 5));
  cVar24 = -(*(char *)((long)ppss->level_sgm + 6) == *(char *)((long)pPVar2->level_sgm + 6));
  cVar25 = -(*(char *)((long)ppss->level_sgm + 7) == *(char *)((long)pPVar2->level_sgm + 7));
  cVar26 = -((char)ppss->level_sgm[2] == (char)pPVar2->level_sgm[2]);
  cVar27 = -(*(char *)((long)ppss->level_sgm + 9) == *(char *)((long)pPVar2->level_sgm + 9));
  cVar28 = -(*(char *)((long)ppss->level_sgm + 10) == *(char *)((long)pPVar2->level_sgm + 10));
  cVar29 = -(*(char *)((long)ppss->level_sgm + 0xb) == *(char *)((long)pPVar2->level_sgm + 0xb));
  cVar30 = -((char)ppss->level_sgm[3] == (char)pPVar2->level_sgm[3]);
  cVar31 = -(*(char *)((long)ppss->level_sgm + 0xd) == *(char *)((long)pPVar2->level_sgm + 0xd));
  cVar32 = -(*(char *)((long)ppss->level_sgm + 0xe) == *(char *)((long)pPVar2->level_sgm + 0xe));
  bVar33 = -(*(char *)((long)ppss->level_sgm + 0xf) == *(char *)((long)pPVar2->level_sgm + 0xf));
  auVar6[1] = cVar19;
  auVar6[0] = cVar18;
  auVar6[2] = cVar20;
  auVar6[3] = cVar21;
  auVar6[4] = cVar22;
  auVar6[5] = cVar23;
  auVar6[6] = cVar24;
  auVar6[7] = cVar25;
  auVar6[8] = cVar26;
  auVar6[9] = cVar27;
  auVar6[10] = cVar28;
  auVar6[0xb] = cVar29;
  auVar6[0xc] = cVar30;
  auVar6[0xd] = cVar31;
  auVar6[0xe] = cVar32;
  auVar6[0xf] = bVar33;
  auVar7[1] = cVar19;
  auVar7[0] = cVar18;
  auVar7[2] = cVar20;
  auVar7[3] = cVar21;
  auVar7[4] = cVar22;
  auVar7[5] = cVar23;
  auVar7[6] = cVar24;
  auVar7[7] = cVar25;
  auVar7[8] = cVar26;
  auVar7[9] = cVar27;
  auVar7[10] = cVar28;
  auVar7[0xb] = cVar29;
  auVar7[0xc] = cVar30;
  auVar7[0xd] = cVar31;
  auVar7[0xe] = cVar32;
  auVar7[0xf] = bVar33;
  auVar15[1] = cVar21;
  auVar15[0] = cVar20;
  auVar15[2] = cVar22;
  auVar15[3] = cVar23;
  auVar15[4] = cVar24;
  auVar15[5] = cVar25;
  auVar15[6] = cVar26;
  auVar15[7] = cVar27;
  auVar15[8] = cVar28;
  auVar15[9] = cVar29;
  auVar15[10] = cVar30;
  auVar15[0xb] = cVar31;
  auVar15[0xc] = cVar32;
  auVar15[0xd] = bVar33;
  auVar13[1] = cVar22;
  auVar13[0] = cVar21;
  auVar13[2] = cVar23;
  auVar13[3] = cVar24;
  auVar13[4] = cVar25;
  auVar13[5] = cVar26;
  auVar13[6] = cVar27;
  auVar13[7] = cVar28;
  auVar13[8] = cVar29;
  auVar13[9] = cVar30;
  auVar13[10] = cVar31;
  auVar13[0xb] = cVar32;
  auVar13[0xc] = bVar33;
  auVar11[1] = cVar23;
  auVar11[0] = cVar22;
  auVar11[2] = cVar24;
  auVar11[3] = cVar25;
  auVar11[4] = cVar26;
  auVar11[5] = cVar27;
  auVar11[6] = cVar28;
  auVar11[7] = cVar29;
  auVar11[8] = cVar30;
  auVar11[9] = cVar31;
  auVar11[10] = cVar32;
  auVar11[0xb] = bVar33;
  auVar9[1] = cVar24;
  auVar9[0] = cVar23;
  auVar9[2] = cVar25;
  auVar9[3] = cVar26;
  auVar9[4] = cVar27;
  auVar9[5] = cVar28;
  auVar9[6] = cVar29;
  auVar9[7] = cVar30;
  auVar9[8] = cVar31;
  auVar9[9] = cVar32;
  auVar9[10] = bVar33;
  bVar17 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB141(auVar15 >> 7,0) & 1) << 2 |
                    (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
                    (ushort)(SUB121(auVar11 >> 7,0) & 1) << 4 |
                    (ushort)(SUB111(auVar9 >> 7,0) & 1) << 5 |
                    (ushort)((byte)(CONCAT19(bVar33,CONCAT18(cVar32,CONCAT17(cVar31,CONCAT16(cVar30,
                                                  CONCAT15(cVar29,CONCAT14(cVar28,CONCAT13(cVar27,
                                                  CONCAT12(cVar26,CONCAT11(cVar25,cVar24))))))))) >>
                                   7) & 1) << 6 |
                    (ushort)((byte)(CONCAT18(bVar33,CONCAT17(cVar32,CONCAT16(cVar31,CONCAT15(cVar30,
                                                  CONCAT14(cVar29,CONCAT13(cVar28,CONCAT12(cVar27,
                                                  CONCAT11(cVar26,cVar25)))))))) >> 7) & 1) << 7 |
                   (ushort)(bVar33 >> 7) << 0xf) != 0xffff;
  pps._7_1_ = bVar17 || bVar16;
  if (ppss->prev_pps == (Pps *)0x0) {
    (pPVar3->sgm).map_modified = '\x01';
  }
  vp8e_put_lit(bitbuf,(uint)(pPVar3->sgm).map_modified,1);
  vp8e_put_lit(bitbuf,(uint)pps._7_1_,1);
  if (bVar17 || bVar16) {
    vp8e_put_lit(bitbuf,1,1);
    for (iStack_24 = 0; iStack_24 < 4; iStack_24 = iStack_24 + 1) {
      iVar1 = pPVar2->qp_sgm[iStack_24];
      vp8e_put_lit(bitbuf,1,1);
      local_54 = iVar1;
      if (iVar1 < 0) {
        local_54 = -iVar1;
      }
      vp8e_put_lit(bitbuf,local_54,7);
      vp8e_put_lit(bitbuf,(uint)(iVar1 < 0),1);
    }
    for (iStack_24 = 0; iStack_24 < 4; iStack_24 = iStack_24 + 1) {
      iVar1 = pPVar2->level_sgm[iStack_24];
      vp8e_put_lit(bitbuf,1,1);
      local_64 = iVar1;
      if (iVar1 < 0) {
        local_64 = -iVar1;
      }
      vp8e_put_lit(bitbuf,local_64,6);
      vp8e_put_lit(bitbuf,(uint)(iVar1 < 0),1);
    }
  }
  if ((pPVar3->sgm).map_modified != '\0') {
    local_70 = (pPVar3->sgm).id_cnt[0] + (pPVar3->sgm).id_cnt[1];
    local_7c = (pPVar3->sgm).id_cnt[2] + (pPVar3->sgm).id_cnt[3];
    local_6c = (local_70 * 0xff) / (local_70 + local_7c);
    if (local_6c < 1) {
      local_68 = 1;
    }
    else {
      if (0xff < local_6c) {
        local_6c = 0xff;
      }
      local_68 = local_6c;
    }
    entropy->segment_prob[0] = local_68;
    if (local_70 == 0) {
      local_70 = 0xff;
    }
    else {
      local_70 = ((pPVar3->sgm).id_cnt[0] * 0xff) / local_70;
    }
    if (local_70 < 1) {
      local_74 = 1;
    }
    else {
      if (local_70 < 0x100) {
        local_78 = local_70;
      }
      else {
        local_78 = 0xff;
      }
      local_74 = local_78;
    }
    entropy->segment_prob[1] = local_74;
    if (local_7c == 0) {
      local_7c = 0xff;
    }
    else {
      local_7c = ((pPVar3->sgm).id_cnt[2] * 0xff) / local_7c;
    }
    if (local_7c < 1) {
      local_80 = 1;
    }
    else {
      if (local_7c < 0x100) {
        local_84 = local_7c;
      }
      else {
        local_84 = 0xff;
      }
      local_80 = local_84;
    }
    entropy->segment_prob[2] = local_80;
    for (iStack_24 = 0; iStack_24 < 3; iStack_24 = iStack_24 + 1) {
      if ((pPVar3->sgm).id_cnt[iStack_24] == 0) {
        vp8e_put_lit(bitbuf,0,1);
      }
      else {
        vp8e_put_lit(bitbuf,1,1);
        vp8e_put_lit(bitbuf,entropy->segment_prob[iStack_24],8);
      }
    }
  }
  *(undefined8 *)ppss->qp_sgm = *(undefined8 *)pPVar2->qp_sgm;
  *(undefined8 *)(ppss->qp_sgm + 2) = *(undefined8 *)(pPVar2->qp_sgm + 2);
  *(undefined8 *)ppss->level_sgm = *(undefined8 *)pPVar2->level_sgm;
  *(undefined8 *)(ppss->level_sgm + 2) = *(undefined8 *)(pPVar2->level_sgm + 2);
  return;
}

Assistant:

static void set_hdr_segmentation(Vp8ePutBitBuf *bitbuf, Vp8ePps *ppss,
                                 Vp8eHalEntropy *entropy)
{
    RK_S32 i, tmp;
    RK_U8 data_modified = 0;

    Pps  *pps = ppss->pps;
    Sgm  *sgm = &ppss->pps->sgm;

    if (memcmp(ppss->qp_sgm, pps->qp_sgm, sizeof(ppss->qp_sgm)))
        data_modified = 1;

    if (memcmp(ppss->level_sgm, pps->level_sgm, sizeof(ppss->level_sgm)))
        data_modified = 1;

    if (!ppss->prev_pps) {
        sgm->map_modified = 1;
    }

    vp8e_put_lit(bitbuf, sgm->map_modified, 1);
    vp8e_put_lit(bitbuf, data_modified, 1);

    if (data_modified) {
        vp8e_put_lit(bitbuf, 1, 1);

        for (i = 0; i < SGM_CNT; i++) {
            tmp = pps->qp_sgm[i];
            vp8e_put_lit(bitbuf, 1, 1);
            vp8e_put_lit(bitbuf, MPP_ABS(tmp), 7);
            vp8e_put_lit(bitbuf, tmp < 0, 1);
        }

        for (i = 0; i < SGM_CNT; i++) {
            tmp = pps->level_sgm[i];
            vp8e_put_lit(bitbuf, 1, 1);
            vp8e_put_lit(bitbuf, MPP_ABS(tmp), 6);
            vp8e_put_lit(bitbuf, tmp < 0, 1);
        }
    }

    if (sgm->map_modified) {
        RK_S32 sum1 = sgm->id_cnt[0] + sgm->id_cnt[1];
        RK_S32 sum2 = sgm->id_cnt[2] + sgm->id_cnt[3];

        tmp = 255 * sum1 / (sum1 + sum2);
        entropy->segment_prob[0] = MPP_CLIP3(1, 255, tmp);

        tmp = sum1 ? 255 * sgm->id_cnt[0] / sum1 : 255;
        entropy->segment_prob[1] = MPP_CLIP3(1, 255, tmp);

        tmp = sum2 ? 255 * sgm->id_cnt[2] / sum2 : 255;
        entropy->segment_prob[2] = MPP_CLIP3(1, 255, tmp);

        for (i = 0; i < 3; i++) {
            if (sgm->id_cnt[i] != 0) {
                vp8e_put_lit(bitbuf, 1, 1);
                vp8e_put_lit(bitbuf, entropy->segment_prob[i], 8);
            } else {
                vp8e_put_lit(bitbuf, 0, 1);
            }
        }
    }

    memcpy(ppss->qp_sgm, pps->qp_sgm, sizeof(ppss->qp_sgm));
    memcpy(ppss->level_sgm, pps->level_sgm, sizeof(ppss->level_sgm));
}